

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precalc_lcp_common.cpp
# Opt level: O1

void DoNotOptimizeAway<lcp_experiment&>(lcp_experiment *x)

{
  lcp_experiment *p;
  
  if (DoNotOptimizeAway<lcp_experiment&>(lcp_experiment&)::ttid == '\0') {
    DoNotOptimizeAway<lcp_experiment&>();
  }
  if (DoNotOptimizeAway<lcp_experiment_&>::ttid._M_thread != 0) {
    return;
  }
  putchar((int)*(char *)&x->text);
  abort();
}

Assistant:

void DoNotOptimizeAway(T&& x) { // copied from https://github.com/DigitalInBlue/Celero/
  static auto ttid = std::this_thread::get_id();
  if(ttid == std::thread::id()) {
    const auto* p = &x;
    putchar(*reinterpret_cast<const char*>(p));
    std::abort();
  }
}